

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

uint __thiscall ThreadContext::ReleaseSourceDynamicProfileManagers(ThreadContext *this,WCHAR *url)

{
  uint uVar1;
  RecyclableData *pRVar2;
  SourceDynamicProfileManagerCache **ppSVar3;
  SourceDynamicProfileManagerCache *local_28;
  WCHAR *local_20;
  WCHAR *url_local;
  
  uVar1 = 0;
  if ((this->recyclableData).ptr != (RecyclableData *)0x0) {
    local_20 = url;
    pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    local_28 = (SourceDynamicProfileManagerCache *)0x0;
    ppSVar3 = JsUtil::
              BaseDictionary<char16_t_const*,ThreadContext::SourceDynamicProfileManagerCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::LookupWithKey<char16_t_const*>
                        ((BaseDictionary<char16_t_const*,ThreadContext::SourceDynamicProfileManagerCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(pRVar2->sourceProfileManagersByUrl).ptr,&local_20,&local_28);
    uVar1 = 0;
    if (*ppSVar3 != (SourceDynamicProfileManagerCache *)0x0) {
      uVar1 = SourceDynamicProfileManagerCache::Release(*ppSVar3);
      if (DAT_0145948a == '\x01') {
        Output::Trace(DynamicProfilePhase,L"Release dynamic source profile manger %d Url: %s\n",
                      (ulong)uVar1,local_20);
      }
      Output::Flush();
      if (uVar1 == 0) {
        pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                           (&this->recyclableData);
        JsUtil::
        BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove((pRVar2->sourceProfileManagersByUrl).ptr,&local_20);
        uVar1 = 0;
      }
    }
  }
  return uVar1;
}

Assistant:

uint ThreadContext::ReleaseSourceDynamicProfileManagers(const WCHAR* url)
{
    // If we've already freed the recyclable data, we're shutting down the thread context so skip clean up
    if (this->recyclableData == nullptr) return 0;

    SourceDynamicProfileManagerCache* managerCache = this->recyclableData->sourceProfileManagersByUrl->Lookup(url, nullptr);
    uint refCount = 0;
    if(managerCache)  // manager cache may be null we exceeded -INMEMORY_CACHE_MAX_URL
    {
        refCount = managerCache->Release();
        OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Release dynamic source profile manger %d Url: %s\n"), refCount, url);
        Output::Flush();
        if(refCount == 0)
        {
            this->recyclableData->sourceProfileManagersByUrl->Remove(url);
        }
    }
    return refCount;
}